

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.h
# Opt level: O0

void __thiscall
ExpressionTranslateContext::ExpressionTranslateContext
          (ExpressionTranslateContext *this,ExpressionContext *ctx,OutputContext *output,
          Allocator *allocator)

{
  Allocator *allocator_local;
  OutputContext *output_local;
  ExpressionContext *ctx_local;
  ExpressionTranslateContext *this_local;
  
  this->ctx = ctx;
  this->output = output;
  SmallArray<unsigned_int,_32U>::SmallArray(&this->loopBreakIdStack,allocator);
  SmallArray<unsigned_int,_32U>::SmallArray(&this->loopContinueIdStack,allocator);
  this->allocator = allocator;
  this->mainName = "main";
  this->indent = "\t";
  this->errorPos = (char *)0x0;
  this->errorBuf = (char *)0x0;
  this->errorBufSize = 0;
  this->depth = 0;
  this->nextLoopBreakId = 1;
  this->nextLoopContinueId = 1;
  this->nextReturnValueId = 1;
  this->skipFunctionDefinitions = false;
  this->currentFunction = (FunctionData *)0x0;
  return;
}

Assistant:

ExpressionTranslateContext(ExpressionContext &ctx, OutputContext &output, Allocator *allocator): ctx(ctx), output(output), loopBreakIdStack(allocator), loopContinueIdStack(allocator), allocator(allocator)
	{
		mainName = "main";

		indent = "\t";

		errorPos = 0;
		errorBuf = 0;
		errorBufSize = 0;

		depth = 0;

		nextLoopBreakId = 1;
		nextLoopContinueId = 1;
		nextReturnValueId = 1;

		skipFunctionDefinitions = false;

		currentFunction = 0;
	}